

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-conv.cc
# Opt level: O0

Dim * __thiscall
dynet::Conv1DNarrow::dim_forward
          (Conv1DNarrow *this,vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  const_reference pvVar7;
  vector<dynet::Dim,_std::allocator<dynet::Dim>_> *in_RDX;
  Dim *in_RDI;
  int ocols;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ostream *in_stack_ffffffffffffffb0;
  
  sVar4 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::size(in_RDX);
  if (sVar4 != 2) {
    std::operator<<((ostream *)&std::cerr,"Conv1DNarrow requires two inputs: ");
    poVar5 = dynet::operator<<(in_stack_ffffffffffffffb0,
                               (vector<dynet::Dim,_std::allocator<dynet::Dim>_> *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Conv1DNarrow requires 2 dimensions");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,0);
  uVar1 = Dim::cols(pvVar7);
  pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,1);
  uVar2 = Dim::cols(pvVar7);
  iVar3 = (uVar1 - uVar2) + 1;
  pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,0);
  uVar2 = Dim::ndims(pvVar7);
  if (uVar2 == 2) {
    pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,1);
    uVar2 = Dim::ndims(pvVar7);
    if (uVar2 == 2) {
      pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,0);
      in_stack_ffffffffffffffa8 = Dim::rows(pvVar7);
      pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,1);
      uVar2 = Dim::rows(pvVar7);
      if ((in_stack_ffffffffffffffa8 == uVar2) && (0 < iVar3)) {
        pvVar7 = std::vector<dynet::Dim,_std::allocator<dynet::Dim>_>::operator[](in_RDX,0);
        uVar1 = Dim::rows(pvVar7);
        x._M_array._4_4_ = iVar3;
        x._M_array._0_4_ = uVar1;
        x._M_len = (size_type)&stack0xffffffffffffffc8;
        Dim::Dim(in_RDI,x);
        return in_RDI;
      }
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad input dimensions in Conv1DNarrow: ");
  poVar5 = dynet::operator<<(in_stack_ffffffffffffffb0,
                             (vector<dynet::Dim,_std::allocator<dynet::Dim>_> *)
                             CONCAT44(uVar1,in_stack_ffffffffffffffa8));
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"bad input dimensions in Conv1DNarrow");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DNarrow::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DNarrow requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DNarrow requires 2 dimensions");
  }
  int ocols = xs[0].cols() - xs[1].cols() + 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows() ||
      ocols < 1) {
    cerr << "Bad input dimensions in Conv1DNarrow: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DNarrow");
  }
  return Dim({xs[0].rows(), (unsigned)ocols});
}